

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_FlateLzwDecode.cc
# Opt level: O3

Pipeline * __thiscall SF_FlateLzwDecode::getDecodePipeline(SF_FlateLzwDecode *this,Pipeline *next)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_5d;
  action_e local_5c;
  Pl_TIFFPredictor *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  uint local_3c;
  value_type local_38;
  uint local_1c;
  Pipeline *next_local;
  uint local_c;
  
  local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  next_local = next;
  if (this->predictor - 10U < 6) {
    local_5c = a_decode;
    local_3c = this->columns;
    if ((int)local_3c < 0) {
      QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(local_3c);
      local_3c = this->columns;
    }
    local_1c = this->colors;
    if ((int)local_1c < 0) {
      QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(local_1c);
      local_1c = this->colors;
    }
    local_c = this->bits_per_component;
    if ((int)local_c < 0) {
      QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(local_c);
      local_c = this->bits_per_component;
    }
    local_58 = (Pl_TIFFPredictor *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_PNGFilter,std::allocator<Pl_PNGFilter>,char_const(&)[11],Pipeline*&,Pl_PNGFilter::action_e,unsigned_int,unsigned_int,unsigned_int>
              (a_Stack_50,(Pl_PNGFilter **)&local_58,(allocator<Pl_PNGFilter> *)&local_5d,
               (char (*) [11])"png decode",&next_local,&local_5c,&local_3c,&local_1c,&local_c);
    _Var2._M_pi = local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_50[0]._M_pi;
    local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_58->super_Pipeline;
    local_58 = (Pl_TIFFPredictor *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi),
       a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
    }
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
              (&this->pipelines,&local_38);
LAB_0024a298:
    next_local = local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else if (this->predictor == 2) {
    local_5c = a_decode;
    local_3c = this->columns;
    if ((int)local_3c < 0) {
      QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(local_3c);
      local_3c = this->columns;
    }
    local_1c = this->colors;
    if ((int)local_1c < 0) {
      QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(local_1c);
      local_1c = this->colors;
    }
    local_c = this->bits_per_component;
    if ((int)local_c < 0) {
      QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(local_c);
      local_c = this->bits_per_component;
    }
    local_58 = (Pl_TIFFPredictor *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_TIFFPredictor,std::allocator<Pl_TIFFPredictor>,char_const(&)[12],Pipeline*&,Pl_TIFFPredictor::action_e,unsigned_int,unsigned_int,unsigned_int>
              (a_Stack_50,&local_58,(allocator<Pl_TIFFPredictor> *)&local_5d,
               (char (*) [12])"tiff decode",&next_local,&local_5c,&local_3c,&local_1c,&local_c);
    _Var2._M_pi = local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_50[0]._M_pi;
    local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_58->super_Pipeline;
    local_58 = (Pl_TIFFPredictor *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi),
       a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
    }
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
              (&this->pipelines,&local_38);
    goto LAB_0024a298;
  }
  if (this->lzw == true) {
    local_58 = (Pl_TIFFPredictor *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_LZWDecoder,std::allocator<Pl_LZWDecoder>,char_const(&)[11],Pipeline*&,bool&>
              (a_Stack_50,(Pl_LZWDecoder **)&local_58,(allocator<Pl_LZWDecoder> *)&local_5c,
               (char (*) [11])"lzw decode",&next_local,&this->early_code_change);
    _Var2._M_pi = local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_50[0]._M_pi;
    local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_58->super_Pipeline;
    local_58 = (Pl_TIFFPredictor *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var2._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0024a365;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
  }
  else {
    local_5c = a_encode;
    local_58 = (Pl_TIFFPredictor *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_Flate,std::allocator<Pl_Flate>,char_const(&)[15],Pipeline*&,Pl_Flate::action_e>
              (a_Stack_50,(Pl_Flate **)&local_58,(allocator<Pl_Flate> *)&local_3c,
               (char (*) [15])"stream inflate",&next_local,&local_5c);
    _Var2._M_pi = local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_50[0]._M_pi;
    local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_58->super_Pipeline;
    local_58 = (Pl_TIFFPredictor *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var2._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0024a365;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
  }
  if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
  }
LAB_0024a365:
  std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
            (&this->pipelines,&local_38);
  peVar1 = local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return &((Pl_TIFFPredictor *)peVar1)->super_Pipeline;
}

Assistant:

Pipeline*
SF_FlateLzwDecode::getDecodePipeline(Pipeline* next)
{
    std::shared_ptr<Pipeline> pipeline;
    if (predictor >= 10 && predictor <= 15) {
        QTC::TC("qpdf", "SF_FlateLzwDecode PNG filter");
        pipeline = std::make_shared<Pl_PNGFilter>(
            "png decode",
            next,
            Pl_PNGFilter::a_decode,
            QIntC::to_uint(columns),
            QIntC::to_uint(colors),
            QIntC::to_uint(bits_per_component));
        pipelines.push_back(pipeline);
        next = pipeline.get();
    } else if (predictor == 2) {
        QTC::TC("qpdf", "SF_FlateLzwDecode TIFF predictor");
        pipeline = std::make_shared<Pl_TIFFPredictor>(
            "tiff decode",
            next,
            Pl_TIFFPredictor::a_decode,
            QIntC::to_uint(columns),
            QIntC::to_uint(colors),
            QIntC::to_uint(bits_per_component));
        pipelines.push_back(pipeline);
        next = pipeline.get();
    }

    if (lzw) {
        pipeline = std::make_shared<Pl_LZWDecoder>("lzw decode", next, early_code_change);
    } else {
        pipeline = std::make_shared<Pl_Flate>("stream inflate", next, Pl_Flate::a_inflate);
    }
    pipelines.push_back(pipeline);
    return pipeline.get();
}